

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O1

bool __thiscall
crnlib::dxt1_endpoint_optimizer::evaluate_solution_hc_uniform
          (dxt1_endpoint_optimizer *this,dxt1_solution_coordinates *coords,bool alternate_rounding)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint16 uVar4;
  dxt1_solution_coordinates dVar5;
  ulong uVar6;
  uint16 uVar7;
  uint uVar8;
  undefined7 in_register_00000011;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  int result;
  uint uVar18;
  ulong uVar19;
  int result_1;
  uint uVar20;
  unique_color *puVar21;
  int result_2;
  uint uVar22;
  bool bVar23;
  color_quad_u8 c1;
  color_quad_u8 c0;
  uint local_78;
  uint local_70;
  uint local_60;
  uint local_58;
  uint local_48;
  uint local_40;
  dxt1_block local_38;
  
  dxt1_block::unpack_color((dxt1_block *)local_38.m_selectors,coords->m_low_color,true,0xff);
  dxt1_block::unpack_color(&local_38,coords->m_high_color,true,0xff);
  iVar13 = (int)CONCAT71(in_register_00000011,alternate_rounding);
  uVar11 = (uint)((ulong)((uint)local_38.m_low_color[0] + iVar13 + (uint)local_38.m_selectors[0] * 2
                         ) * 0x55555556 >> 0x20);
  if (0xfe < uVar11) {
    uVar11 = 0xff;
  }
  uVar12 = (uint)((ulong)((uint)local_38.m_low_color[1] + iVar13 + (uint)local_38.m_selectors[1] * 2
                         ) * 0x55555556 >> 0x20);
  if (0xfe < uVar12) {
    uVar12 = 0xff;
  }
  uVar18 = (uint)((ulong)((uint)local_38.m_high_color[0] + iVar13 +
                         (uint)local_38.m_selectors[2] * 2) * 0x55555556 >> 0x20);
  if (0xfe < uVar18) {
    uVar18 = 0xff;
  }
  uVar20 = (uint)((ulong)((uint)local_38.m_selectors[0] + iVar13 + (uint)local_38.m_low_color[0] * 2
                         ) * 0x55555556 >> 0x20);
  if (0xfe < uVar20) {
    uVar20 = 0xff;
  }
  uVar22 = (uint)((ulong)((uint)local_38.m_selectors[1] + iVar13 + (uint)local_38.m_low_color[1] * 2
                         ) * 0x55555556 >> 0x20);
  if (0xfe < uVar22) {
    uVar22 = 0xff;
  }
  uVar15 = (uint)((ulong)((uint)local_38.m_selectors[2] + iVar13 +
                         (uint)local_38.m_high_color[0] * 2) * 0x55555556 >> 0x20);
  uVar10 = 0xff;
  if (uVar15 < 0xff) {
    uVar10 = uVar15;
  }
  uVar9 = (this->m_evaluated_colors).m_size;
  if (uVar9 == 0) {
    uVar19 = 0;
  }
  else {
    puVar21 = (this->m_evaluated_colors).m_p;
    uVar19 = 0;
    do {
      bVar1 = (puVar21->m_color).field_0.field_0.r;
      bVar2 = (puVar21->m_color).field_0.field_0.g;
      uVar8 = (uint)bVar2;
      bVar3 = (puVar21->m_color).field_0.field_0.b;
      local_40 = (uint)local_38.m_selectors[0];
      iVar13 = bVar1 - local_40;
      local_58 = (uint)local_38.m_selectors[1];
      local_70 = (uint)local_38.m_selectors[2];
      iVar16 = bVar3 - local_70;
      uVar17 = iVar16 * iVar16 + (uVar8 - local_58) * (uVar8 - local_58) + iVar13 * iVar13;
      local_48 = (uint)local_38.m_low_color[0];
      iVar16 = bVar1 - local_48;
      local_60 = (uint)local_38.m_low_color[1];
      iVar13 = bVar2 - local_60;
      local_78 = (uint)local_38.m_high_color[0];
      iVar14 = bVar3 - local_78;
      uVar15 = iVar14 * iVar14 + iVar13 * iVar13 + iVar16 * iVar16;
      if (uVar17 < uVar15) {
        uVar15 = uVar17;
      }
      iVar13 = bVar3 - uVar18;
      uVar17 = iVar13 * iVar13 +
               (uVar8 - uVar12) * (uVar8 - uVar12) + (bVar1 - uVar11) * (bVar1 - uVar11);
      iVar13 = bVar3 - uVar10;
      uVar8 = iVar13 * iVar13 +
              (uVar8 - uVar22) * (uVar8 - uVar22) + (bVar1 - uVar20) * (bVar1 - uVar20);
      if (uVar17 < uVar8) {
        uVar8 = uVar17;
      }
      if (uVar15 < uVar8) {
        uVar8 = uVar15;
      }
      uVar19 = (ulong)puVar21->m_weight * (ulong)uVar8 + uVar19;
      if (uVar19 < (this->m_best_solution).m_error) {
        uVar9 = uVar9 - 1;
      }
      else {
        uVar9 = 0;
      }
      puVar21 = puVar21 + 1;
    } while (uVar9 != 0);
  }
  uVar6 = (this->m_best_solution).m_error;
  if (uVar19 < uVar6) {
    dVar5 = *coords;
    (this->m_best_solution).m_coords = dVar5;
    (this->m_best_solution).m_error = uVar19;
    (this->m_best_solution).m_alpha_block = false;
    (this->m_best_solution).m_alternate_rounding = alternate_rounding;
    uVar4 = (this->m_best_solution).m_coords.m_high_color;
    uVar7 = dVar5.m_low_color;
    (this->m_best_solution).m_enforce_selector = uVar7 == uVar4;
    if (uVar7 == uVar4) {
      bVar23 = (~(uint)dVar5 & 0x1f) != 0;
      if (bVar23) {
        (this->m_best_solution).m_coords.m_low_color = uVar7 + 1;
      }
      else {
        (this->m_best_solution).m_coords.m_high_color = uVar4 - 1;
      }
      (this->m_best_solution).m_enforced_selector = bVar23;
    }
  }
  return uVar19 < uVar6;
}

Assistant:

bool dxt1_endpoint_optimizer::evaluate_solution_hc_uniform(const dxt1_solution_coordinates& coords, bool alternate_rounding) {
  color_quad_u8 c0 = dxt1_block::unpack_color(coords.m_low_color, true);
  color_quad_u8 c1 = dxt1_block::unpack_color(coords.m_high_color, true);
  color_quad_u8 c2((c0.r * 2 + c1.r + alternate_rounding) / 3, (c0.g * 2 + c1.g + alternate_rounding) / 3, (c0.b * 2 + c1.b + alternate_rounding) / 3, 0);
  color_quad_u8 c3((c1.r * 2 + c0.r + alternate_rounding) / 3, (c1.g * 2 + c0.g + alternate_rounding) / 3, (c1.b * 2 + c0.b + alternate_rounding) / 3, 0);
  uint64 error = 0;
  unique_color* color = m_evaluated_colors.get_ptr();
  for (uint count = m_evaluated_colors.size(); count; color++, error < m_best_solution.m_error ? count-- : count = 0) {
    uint e01 = math::minimum(color::color_distance(false, color->m_color, c0, false), color::color_distance(false, color->m_color, c1, false));
    uint e23 = math::minimum(color::color_distance(false, color->m_color, c2, false), color::color_distance(false, color->m_color, c3, false));
    error += math::minimum(e01, e23) * (uint64)color->m_weight;
  }
  if (error >= m_best_solution.m_error)
    return false;
  m_best_solution.m_coords = coords;
  m_best_solution.m_error = error;
  m_best_solution.m_alpha_block = false;
  m_best_solution.m_alternate_rounding = alternate_rounding;
  m_best_solution.m_enforce_selector = m_best_solution.m_coords.m_low_color == m_best_solution.m_coords.m_high_color;
  if (m_best_solution.m_enforce_selector) {
    if ((m_best_solution.m_coords.m_low_color & 31) != 31) {
      m_best_solution.m_coords.m_low_color++;
      m_best_solution.m_enforced_selector = 1;
    } else {
      m_best_solution.m_coords.m_high_color--;
      m_best_solution.m_enforced_selector = 0;
    }
  }
  return true;
}